

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# source_context.pb.cc
# Opt level: O0

void __thiscall google::protobuf::SourceContext::~SourceContext(SourceContext *this)

{
  SourceContext *this_local;
  
  ~SourceContext(this);
  operator_delete(this,0x20);
  return;
}

Assistant:

SourceContext::~SourceContext() {
  // @@protoc_insertion_point(destructor:google.protobuf.SourceContext)
  SharedDtor(*this);
}